

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivBound.cpp
# Opt level: O2

void TPZShapeHDivBound<pzshape::TPZShapePoint>::Initialize
               (TPZVec<long> *ids,int connectorder,int sideorient,TPZShapeData *data)

{
  TPZManVector<int,_27> *this;
  int connectorder_local;
  
  connectorder_local = connectorder;
  TPZManVector<int,_20>::Resize(&data->fSideOrient,1);
  *(data->fSideOrient).super_TPZVec<int>.fStore = sideorient;
  this = &data->fH1ConnectOrders;
  TPZManVector<int,_27>::Resize(this,1,&connectorder_local);
  TPZVec<int>::Fill(&this->super_TPZVec<int>,&connectorder_local,0,-1);
  if (0 < connectorder_local) {
    TPZShapeH1<pzshape::TPZShapePoint>::Initialize(ids,&this->super_TPZVec<int>,data);
  }
  return;
}

Assistant:

void TPZShapeHDivBound<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           int connectorder, int sideorient,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
#ifdef PZDEBUG
    if(ids.size() != ncorner || connectorder < 0 || std::abs(sideorient) != 1)
    {
        DebugStop();
    }
#endif
    data.fSideOrient.Resize(1);
    data.fSideOrient[0] = sideorient;
    int connectOrdersSize = nsides-ncorner;
    if (TSHAPE::Type() == EPoint){
        connectOrdersSize = 1;
    }
    data.fH1ConnectOrders.Resize(connectOrdersSize, connectorder);
    data.fH1ConnectOrders.Fill(connectorder);
    if(connectorder > 0)
    {
        TPZShapeH1<TSHAPE>::Initialize(ids,data.fH1ConnectOrders,data);
    }
}